

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_full.c
# Opt level: O2

int picnic_l3_full_keygen(picnic_l3_full_publickey_t *pk,picnic_l3_full_privatekey_t *sk)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  if (sk != (picnic_l3_full_privatekey_t *)0x0 && pk != (picnic_l3_full_publickey_t *)0x0) {
    iVar2 = rand_bits(sk->data,0xc0);
    if (iVar2 == 0) {
      iVar2 = rand_bits(sk->data + 0x30,0xc0);
      if (iVar2 == 0) {
        iVar2 = picnic_l3_full_sk_to_pk(sk,pk);
        if (iVar2 == 0) {
          iVar3 = 0;
          *(undefined8 *)(sk->data + 0x28) = *(undefined8 *)(pk->data + 0x10);
          uVar1 = *(undefined8 *)(pk->data + 8);
          *(undefined8 *)(sk->data + 0x18) = *(undefined8 *)pk->data;
          *(undefined8 *)(sk->data + 0x20) = uVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_full_keygen(picnic_l3_full_publickey_t* pk,
                                                  picnic_l3_full_privatekey_t* sk) {
  if (!pk || !sk) {
    return -1;
  }

  uint8_t* sk_sk = SK_SK(sk);
  uint8_t* sk_pt = SK_PT(sk);
  uint8_t* sk_c  = SK_C(sk);

  // generate private key
  // random secret key
  if (rand_bits(sk_sk, LOWMC_BLOCK_BITS)) {
    return -1;
  }
  // random plain text
  if (rand_bits(sk_pt, LOWMC_BLOCK_BITS)) {
    return -1;
  }
  // encrypt plaintext under secret key
  if (picnic_l3_full_sk_to_pk(sk, pk)) {
    return -1;
  }
  // copy ciphertext to secret key
  memcpy(sk_c, PK_C(pk), LOWMC_BLOCK_SZ);
  return 0;
}